

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O2

void push_heap_suite::push_decreasing_custom(void)

{
  array<int,_5UL> *paVar1;
  int *piVar2;
  int local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  array<int,_5UL> expect;
  int local_34;
  
  local_58 = 0;
  uStack_50 = 0;
  local_5c = 0x37;
  vista::push_heap<false,int*,xless<int,1431655765>>(&local_5c);
  piVar2 = &local_34;
  expect._M_elems[0] = 0x37;
  expect._M_elems[1] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  expect._M_elems[4] = 0;
  paVar1 = &expect;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0xe8,"void push_heap_suite::push_decreasing_custom()",&local_5c,expect._M_elems,
             expect._M_elems,piVar2);
  local_58 = CONCAT44(local_58._4_4_,0x2c);
  vista::push_heap<false,int*,xless<int,1431655765>>(&local_5c,(long)&local_58 + 4,piVar2,paVar1);
  expect._M_elems[0] = 0x2c;
  expect._M_elems[1] = 0x37;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  expect._M_elems[4] = 0;
  paVar1 = &expect;
  piVar2 = &local_34;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0xef,"void push_heap_suite::push_decreasing_custom()",&local_5c,expect._M_elems,
             expect._M_elems,&local_34);
  local_58 = CONCAT44(0x21,(undefined4)local_58);
  vista::push_heap<false,int*,xless<int,1431655765>>(&local_5c,&uStack_50,piVar2,paVar1);
  expect._M_elems[0] = 0x2c;
  expect._M_elems[1] = 0x37;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0;
  expect._M_elems[4] = 0;
  paVar1 = &expect;
  piVar2 = &local_34;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0xf6,"void push_heap_suite::push_decreasing_custom()",&local_5c,expect._M_elems,
             expect._M_elems,&local_34);
  uStack_50 = CONCAT44(uStack_50._4_4_,0x16);
  vista::push_heap<false,int*,xless<int,1431655765>>(&local_5c,(long)&uStack_50 + 4,piVar2,paVar1);
  expect._M_elems[0] = 0x2c;
  expect._M_elems[1] = 0x37;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0x16;
  expect._M_elems[4] = 0;
  paVar1 = &expect;
  piVar2 = &local_34;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0xfd,"void push_heap_suite::push_decreasing_custom()",&local_5c,expect._M_elems,
             expect._M_elems,&local_34);
  uStack_50 = CONCAT44(0xb,(undefined4)uStack_50);
  vista::push_heap<false,int*,xless<int,1431655765>>(&local_5c,&expect,piVar2,paVar1);
  expect._M_elems[0] = 0x2c;
  expect._M_elems[1] = 0x37;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0x16;
  expect._M_elems[4] = 0xb;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x104,"void push_heap_suite::push_decreasing_custom()",&local_5c,expect._M_elems,
             expect._M_elems,&local_34);
  return;
}

Assistant:

void push_decreasing_custom()
{
    xless<int, 0x55555555> custom;

    std::array<int, 5> heap = {};
    auto last = heap.begin();
    *last++ = 55;
    vista::push_heap(heap.begin(), last, custom);
    {
        std::array<int, 5> expect = { 55, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 44;
    vista::push_heap(heap.begin(), last, custom);
    {
        std::array<int, 5> expect = { 44, 55, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 33;
    vista::push_heap(heap.begin(), last, custom);
    {
        std::array<int, 5> expect = { 44, 55, 33, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 22;
    vista::push_heap(heap.begin(), last, custom);
    {
        std::array<int, 5> expect = { 44, 55, 33, 22, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 11;
    vista::push_heap(heap.begin(), last, custom);
    {
        std::array<int, 5> expect = { 44, 55, 33, 22, 11 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
}